

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O2

int __thiscall CCNR::ls_solver::pick_var(ls_solver *this)

{
  int iVar1;
  int *piVar2;
  pointer pvVar3;
  pointer piVar4;
  pointer pcVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  iterator __begin2;
  int *piVar10;
  ulong uVar11;
  iterator __end2;
  undefined8 *puVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  
  piVar10 = (this->_ccd_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar2 = (this->_ccd_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar9 = (long)piVar2 - (long)piVar10;
  if (lVar9 == 0) {
    if (this->_aspiration_active == true) {
      this->_aspiration_score = this->_avg_clause_weight;
      pvVar3 = (this->_vars).super__Vector_base<CCNR::variable,_std::allocator<CCNR::variable>_>.
               _M_impl.super__Vector_impl_data._M_start;
      piVar4 = (this->_unsat_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar11 = (long)(this->_unsat_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)piVar4 >> 2;
      uVar13 = 0;
      while( true ) {
        uVar6 = uVar11;
        iVar7 = 0;
        if (uVar11 == uVar13) goto LAB_0012aca4;
        lVar9 = (long)piVar4[uVar13];
        if ((long)this->_avg_clause_weight < pvVar3[lVar9].score) break;
        uVar13 = uVar13 + 1;
      }
      do {
        uVar6 = uVar13;
        iVar7 = (int)lVar9;
LAB_0012aca4:
        while( true ) {
          uVar13 = uVar6 + 1;
          if (uVar11 <= uVar13) {
            if (iVar7 != 0) {
              return iVar7;
            }
            goto LAB_0012acec;
          }
          lVar9 = (long)piVar4[uVar13];
          if (pvVar3[iVar7].score < pvVar3[lVar9].score) break;
          uVar6 = uVar13;
          if ((pvVar3[lVar9].score == pvVar3[iVar7].score) &&
             (pvVar3[lVar9].last_flip_step < pvVar3[iVar7].last_flip_step)) {
            iVar7 = piVar4[uVar13];
          }
        }
      } while( true );
    }
LAB_0012acec:
    update_clause_weights(this);
    uVar8 = Mersenne::next(&this->_random_gen,
                           (int)((ulong)((long)(this->_unsat_clauses).
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_finish -
                                        (long)(this->_unsat_clauses).
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start) >> 2));
    iVar1 = (this->_unsat_clauses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8];
    pvVar3 = (this->_vars).super__Vector_base<CCNR::variable,_std::allocator<CCNR::variable>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pcVar5 = (this->_clauses).super__Vector_base<CCNR::clause,_std::allocator<CCNR::clause>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar9 = *(long *)&pcVar5[iVar1].literals.
                      super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl;
    iVar7 = *(int *)(lVar9 + 8);
    puVar12 = (undefined8 *)(lVar9 + 0x18);
    for (lVar14 = 1;
        lVar14 < (int)((ulong)((long)*(pointer *)
                                      ((long)&pcVar5[iVar1].literals.
                                              super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>
                                              ._M_impl + 8) - lVar9) >> 4); lVar14 = lVar14 + 1) {
      iVar15 = (int)*puVar12;
      if ((pvVar3[iVar15].score <= pvVar3[iVar7].score) &&
         ((pvVar3[iVar15].score != pvVar3[iVar7].score ||
          (pvVar3[iVar7].last_flip_step <= pvVar3[iVar15].last_flip_step)))) {
        iVar15 = iVar7;
      }
      iVar7 = iVar15;
      puVar12 = puVar12 + 2;
    }
  }
  else {
    this->_mems = this->_mems + (lVar9 >> 2);
    iVar7 = *piVar10;
    pvVar3 = (this->_vars).super__Vector_base<CCNR::variable,_std::allocator<CCNR::variable>_>.
             _M_impl.super__Vector_impl_data._M_start;
    for (; piVar10 != piVar2; piVar10 = piVar10 + 1) {
      iVar1 = *piVar10;
      if ((pvVar3[iVar1].score <= pvVar3[iVar7].score) &&
         ((pvVar3[iVar1].score != pvVar3[iVar7].score ||
          (pvVar3[iVar7].last_flip_step <= pvVar3[iVar1].last_flip_step)))) {
        iVar1 = iVar7;
      }
      iVar7 = iVar1;
    }
  }
  return iVar7;
}

Assistant:

int ls_solver::pick_var()
{
    size_t i;
    int k, c, v;
    int best_var = 0;

    // if(_random_gen.nextClosed() < _prob_p){
    // 	c = _unsat_clauses[_random_gen.next(_unsat_clauses.size())];
    // 	clause * cp = &(_clauses[c]);
    // 	return cp->literals[_random_gen.next(cp->literals.size())].var_num;
    // }


    if (_ccd_vars.size() > 0) {
        _mems += _ccd_vars.size();
        best_var = _ccd_vars[0];
        for (int v : _ccd_vars) {
            if (_vars[v].score > _vars[best_var].score) {
                best_var = v;
            } else if (_vars[v].score == _vars[best_var].score && _vars[v].last_flip_step < _vars[best_var].last_flip_step) {
                best_var = v;
            }
        }
        return best_var;
    }

    // Aspriation Mode

    //----------------------------------------
    if (_aspiration_active) {
        // if(_random_gen.nextClosed() < _prob_p){
        // 	c = _unsat_clauses[_random_gen.next(_unsat_clauses.size())];
        // 	clause * cp = &(_clauses[c]);
        // 	return cp->literals[_random_gen.next(cp->literals.size())].var_num;
        // }

        _aspiration_score = _avg_clause_weight;
        for (i = 0; i < _unsat_vars.size(); ++i) {
            v = _unsat_vars[i];
            if (_vars[v].score > _aspiration_score) {
                best_var = v;
                break;
            }
        }
        for (++i; i < _unsat_vars.size(); ++i) {
            v = _unsat_vars[i];
            if (_vars[v].score > _vars[best_var].score)
                best_var = v;
            else if (_vars[v].score == _vars[best_var].score && _vars[v].last_flip_step < _vars[best_var].last_flip_step)
                best_var = v;
        }
        if (best_var != 0) return best_var;
    }
    //=========================================


    /**Diversification Mode**/
    update_clause_weights();

    /*focused random walk*/
    c = _unsat_clauses[_random_gen.next(_unsat_clauses.size())];
    clause *cp = &(_clauses[c]);
    best_var = cp->literals[0].var_num;
    int cp_lits_sz = cp->literals.size();
    for (k = 1; k < cp_lits_sz; k++) {
        v = cp->literals[k].var_num;
        if (_vars[v].score > _vars[best_var].score) {
            best_var = v;
        } else if (_vars[v].score == _vars[best_var].score && _vars[v].last_flip_step < _vars[best_var].last_flip_step) {
            best_var = v;
        }
    }
    return best_var;
}